

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>::
operator()(object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>>
           *this,shared_ptr<Person> *args)

{
  shared_ptr<Person> *in_RDX;
  object oStack_18;
  
  make_tuple<(pybind11::return_value_policy)1,std::shared_ptr<Person>&>
            ((pybind11 *)&oStack_18,in_RDX);
  accessor<pybind11::detail::accessor_policies::generic_item>::get_cache
            ((accessor<pybind11::detail::accessor_policies::generic_item> *)args);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&oStack_18);
  object::~object(&oStack_18);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}